

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

DisasJumpType op_stm(DisasContext_conflict13 *s,DisasOps *o)

{
  uint uVar1;
  int iVar2;
  TCGContext_conflict12 *tcg_ctx;
  TCGv_i64 pTVar3;
  TCGv_i64 pTVar4;
  uint uVar5;
  TCGv_i64 pTVar6;
  MemOp_conflict memop;
  uint uVar7;
  ulong uVar8;
  
  uVar7 = (s->fields).presentO;
  if (((uVar7 & 1) != 0) && ((uVar7 & 4) != 0)) {
    tcg_ctx = s->uc->tcg_ctx;
    uVar7 = (s->fields).c[0];
    uVar8 = (ulong)(int)uVar7;
    uVar1 = (s->fields).c[2];
    iVar2 = (int)s->insn->data;
    pTVar6 = tcg_const_i64_s390x(tcg_ctx,(long)iVar2);
    pTVar3 = tcg_ctx->regs[uVar8];
    pTVar4 = o->in2;
    uVar5 = get_mem_index((DisasContext_conflict13 *)(ulong)((s->base).tb)->flags);
    memop = iVar2 == 8 | MO_BEUL;
    tcg_gen_qemu_st_i64_s390x(tcg_ctx,pTVar3,pTVar4,(ulong)uVar5,memop);
    while (uVar7 != uVar1) {
      tcg_gen_op3_s390x(tcg_ctx,INDEX_op_add_i64,(TCGArg)(o->in2 + (long)tcg_ctx),
                        (TCGArg)(o->in2 + (long)tcg_ctx),(TCGArg)(pTVar6 + (long)tcg_ctx));
      uVar7 = (int)uVar8 + 1U & 0xf;
      uVar8 = (ulong)uVar7;
      pTVar3 = tcg_ctx->regs[uVar8];
      pTVar4 = o->in2;
      uVar5 = get_mem_index((DisasContext_conflict13 *)(ulong)((s->base).tb)->flags);
      tcg_gen_qemu_st_i64_s390x(tcg_ctx,pTVar3,pTVar4,(ulong)uVar5,memop);
    }
    tcg_temp_free_internal_s390x(tcg_ctx,(TCGTemp *)(pTVar6 + (long)tcg_ctx));
    return DISAS_NEXT;
  }
  __assert_fail("have_field1(s, o)",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/s390x/translate.c"
                ,0x44d,
                "int get_field1(const DisasContext *, enum DisasFieldIndexO, enum DisasFieldIndexC)"
               );
}

Assistant:

static DisasJumpType op_stm(DisasContext *s, DisasOps *o)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int r1 = get_field(s, r1);
    int r3 = get_field(s, r3);
    int size = s->insn->data;
    TCGv_i64 tsize = tcg_const_i64(tcg_ctx, size);

    while (1) {
        if (size == 8) {
            tcg_gen_qemu_st64(tcg_ctx, tcg_ctx->regs[r1], o->in2, get_mem_index(s));
        } else {
            tcg_gen_qemu_st32(tcg_ctx, tcg_ctx->regs[r1], o->in2, get_mem_index(s));
        }
        if (r1 == r3) {
            break;
        }
        tcg_gen_add_i64(tcg_ctx, o->in2, o->in2, tsize);
        r1 = (r1 + 1) & 15;
    }

    tcg_temp_free_i64(tcg_ctx, tsize);
    return DISAS_NEXT;
}